

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void dump(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  element_type *peVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  FastText fasttext;
  string option;
  string modelPath;
  FastText *in_stack_fffffffffffffd48;
  undefined6 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  FastText *in_stack_fffffffffffffd58;
  FastText *in_stack_fffffffffffffd80;
  FastText *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffdd8;
  Args *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffe18;
  Dictionary *in_stack_fffffffffffffe20;
  FastText local_d8;
  string local_48 [32];
  string *in_stack_ffffffffffffffd8;
  FastText *in_stack_ffffffffffffffe0;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar2 < 4) {
    printDumpUsage();
    exit(1);
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd8,(string *)pvVar3);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,3);
  std::__cxx11::string::string(local_48,(string *)pvVar3);
  ::fasttext::FastText::FastText(in_stack_fffffffffffffd80);
  ::fasttext::FastText::loadModel(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd57,
                                   CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)),
                          (char *)in_stack_fffffffffffffd48);
  if (bVar1) {
    ::fasttext::FastText::getArgs(in_stack_fffffffffffffd58);
    ::fasttext::Args::dump(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    ::fasttext::Args::~Args
              ((Args *)CONCAT17(in_stack_fffffffffffffd57,
                                CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)));
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd57,
                                     CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)),
                            (char *)in_stack_fffffffffffffd48);
    if (bVar1) {
      ::fasttext::FastText::getDictionary(in_stack_fffffffffffffd48);
      std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1da10a);
      ::fasttext::Dictionary::dump(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
                ((shared_ptr<const_fasttext::Dictionary> *)0x1da125);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd57,
                                       CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)
                                      ),(char *)in_stack_fffffffffffffd48);
      if (bVar1) {
        bVar1 = ::fasttext::FastText::isQuant(&local_d8);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Not supported for quantized models.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        else {
          ::fasttext::FastText::getInputMatrix(in_stack_fffffffffffffd88);
          peVar5 = std::
                   __shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1da1de);
          (*(peVar5->super_Matrix)._vptr_Matrix[9])(peVar5,&std::cout);
          std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
                    ((shared_ptr<const_fasttext::DenseMatrix> *)0x1da1fd);
        }
      }
      else {
        in_stack_fffffffffffffd57 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffd57,
                                      CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50))
                             ,(char *)in_stack_fffffffffffffd48);
        if (!(bool)in_stack_fffffffffffffd57) {
          printDumpUsage();
          exit(1);
        }
        in_stack_fffffffffffffd56 = ::fasttext::FastText::isQuant(&local_d8);
        if ((bool)in_stack_fffffffffffffd56) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Not supported for quantized models.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        else {
          ::fasttext::FastText::getOutputMatrix(in_stack_fffffffffffffd88);
          peVar5 = std::
                   __shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1da2b6);
          (*(peVar5->super_Matrix)._vptr_Matrix[9])(peVar5,&std::cout);
          std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
                    ((shared_ptr<const_fasttext::DenseMatrix> *)0x1da2d5);
        }
      }
    }
  }
  ::fasttext::FastText::~FastText
            ((FastText *)
             CONCAT17(in_stack_fffffffffffffd57,
                      CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)));
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void dump(const std::vector<std::string>& args) {
  if (args.size() < 4) {
    printDumpUsage();
    exit(EXIT_FAILURE);
  }

  std::string modelPath = args[2];
  std::string option = args[3];

  FastText fasttext;
  fasttext.loadModel(modelPath);
  if (option == "args") {
    fasttext.getArgs().dump(std::cout);
  } else if (option == "dict") {
    fasttext.getDictionary()->dump(std::cout);
  } else if (option == "input") {
    if (fasttext.isQuant()) {
      std::cerr << "Not supported for quantized models." << std::endl;
    } else {
      fasttext.getInputMatrix()->dump(std::cout);
    }
  } else if (option == "output") {
    if (fasttext.isQuant()) {
      std::cerr << "Not supported for quantized models." << std::endl;
    } else {
      fasttext.getOutputMatrix()->dump(std::cout);
    }
  } else {
    printDumpUsage();
    exit(EXIT_FAILURE);
  }
}